

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_grouping.cpp
# Opt level: O1

int16_t anon_unknown.dwarf_1ad4fb::getMinGroupingForLocale(Locale *locale)

{
  UChar *pUVar1;
  int16_t iVar2;
  int32_t resultLen;
  UErrorCode localStatus;
  LocalUResourceBundlePointer bundle;
  int32_t local_20;
  UErrorCode local_1c;
  LocalUResourceBundlePointer local_18;
  
  local_1c = U_ZERO_ERROR;
  local_18.super_LocalPointerBase<UResourceBundle>.ptr =
       (LocalPointerBase<UResourceBundle>)ures_open_63((char *)0x0,locale->fullName,&local_1c);
  local_20 = 0;
  pUVar1 = ures_getStringByKeyWithFallback_63
                     ((UResourceBundle *)local_18.super_LocalPointerBase<UResourceBundle>.ptr,
                      "NumberElements/minimumGroupingDigits",&local_20,&local_1c);
  iVar2 = 1;
  if ((local_1c < U_ILLEGAL_ARGUMENT_ERROR) && (local_20 == 1)) {
    iVar2 = *pUVar1 + L'￐';
  }
  icu_63::LocalUResourceBundlePointer::~LocalUResourceBundlePointer(&local_18);
  return iVar2;
}

Assistant:

int16_t getMinGroupingForLocale(const Locale& locale) {
    // TODO: Cache this?
    UErrorCode localStatus = U_ZERO_ERROR;
    LocalUResourceBundlePointer bundle(ures_open(NULL, locale.getName(), &localStatus));
    int32_t resultLen = 0;
    const char16_t* result = ures_getStringByKeyWithFallback(
        bundle.getAlias(),
        "NumberElements/minimumGroupingDigits",
        &resultLen,
        &localStatus);
    // TODO: Is it safe to assume resultLen == 1? Would locales set minGrouping >= 10?
    if (U_FAILURE(localStatus) || resultLen != 1) {
        return 1;
    }
    return result[0] - u'0';
}